

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  rnndomain *prVar3;
  fout f;
  fout *pfVar4;
  char cVar5;
  rnndb *db;
  size_t sVar6;
  char *pcVar7;
  FILE *pFVar8;
  ushort **ppuVar9;
  __int32_t **pp_Var10;
  rnnenum *prVar11;
  rnnbitset *prVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  
  if (argc < 2) {
    fwrite("Usage:\n\theadergen database-file\n",0x20,1,_stderr);
  }
  else {
    lVar15 = 0;
    rnn_init();
    db = rnn_newdb();
    rnn_parsefile(db,argv[1]);
    rnn_prepdb(db);
    while( true ) {
      if (db->filesnum <= lVar15) {
        for (lVar15 = 0; lVar15 < db->enumsnum; lVar15 = lVar15 + 1) {
          prVar11 = db->enums[lVar15];
          if (prVar11->isinline == 0) {
            for (lVar16 = 0; lVar16 < prVar11->valsnum; lVar16 = lVar16 + 1) {
              printvalue(prVar11->vals[lVar16],0);
              prVar11 = db->enums[lVar15];
            }
          }
        }
        for (lVar15 = 0; lVar15 < db->bitsetsnum; lVar15 = lVar15 + 1) {
          prVar12 = db->bitsets[lVar15];
          if (prVar12->isinline == 0) {
            for (lVar16 = 0; lVar16 < prVar12->bitfieldsnum; lVar16 = lVar16 + 1) {
              printbitfield(prVar12->bitfields[lVar16],0);
              prVar12 = db->bitsets[lVar15];
            }
          }
        }
        for (lVar15 = 0; lVar15 < db->domainsnum; lVar15 = lVar15 + 1) {
          prVar3 = db->domains[lVar15];
          if (prVar3->size != 0) {
            printdef(prVar3->fullname,"SIZE",0,prVar3->size,prVar3->file);
          }
          for (lVar16 = 0; lVar16 < db->domains[lVar15]->subelemsnum; lVar16 = lVar16 + 1) {
            printdelem(db->domains[lVar15]->subelems[lVar16],0);
          }
        }
        lVar15 = 0x10;
        for (lVar16 = 0; lVar16 < foutsnum; lVar16 = lVar16 + 1) {
          fprintf(*(FILE **)((long)fouts + lVar15 + -8),"\n#endif /* %s */\n",
                  *(undefined8 *)((long)&fouts->name + lVar15));
          lVar15 = lVar15 + 0x18;
        }
        return db->estatus;
      }
      pcVar2 = db->files[lVar15];
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 3);
      strcpy(pcVar7,pcVar2);
      sVar6 = strlen(pcVar7);
      (pcVar7 + sVar6)[0] = '.';
      (pcVar7 + sVar6)[1] = 'h';
      pcVar7[sVar6 + 2] = '\0';
      pcVar2 = db->files[lVar15];
      pFVar8 = fopen(pcVar7,"w");
      if (pFVar8 == (FILE *)0x0) break;
      free(pcVar7);
      pcVar7 = strdup(pcVar2);
      uVar14 = 0;
      while( true ) {
        sVar6 = strlen(pcVar7);
        if (sVar6 <= uVar14) break;
        ppuVar9 = __ctype_b_loc();
        cVar1 = pcVar7[uVar14];
        cVar5 = '_';
        if (((*ppuVar9)[cVar1] & 8) != 0) {
          pp_Var10 = __ctype_toupper_loc();
          cVar5 = (char)(*pp_Var10)[cVar1];
        }
        pcVar7[uVar14] = cVar5;
        uVar14 = uVar14 + 1;
      }
      iVar13 = foutsnum;
      if (foutsmax <= foutsnum) {
        iVar13 = foutsmax * 2;
        if (foutsmax == 0) {
          iVar13 = 0x10;
        }
        foutsmax = iVar13;
        fouts = (fout *)realloc(fouts,(long)iVar13 * 0x18);
        iVar13 = foutsnum;
      }
      pfVar4 = fouts;
      foutsnum = iVar13 + 1;
      fouts[iVar13].guard = pcVar7;
      pfVar4[iVar13].name = pcVar2;
      pfVar4[iVar13].file = (FILE *)pFVar8;
      f.file = (FILE *)pFVar8;
      f.name = pcVar2;
      f.guard = pcVar7;
      printhead(f,db);
      lVar15 = lVar15 + 1;
    }
    perror(pcVar7);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		f.guard = strdup(f.name);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	return db->estatus;
}